

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O1

void util::anon_unknown_0::windows1252_to_utf8(string *from,string *to)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  byte bVar4;
  unicode_char chr;
  size_type sVar5;
  logger local_1b0;
  
  to->_M_string_length = 0;
  *(to->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::reserve((ulong)to);
  sVar2 = from->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (from->_M_dataplus)._M_p;
    sVar5 = 0;
    bVar4 = 0;
    do {
      bVar1 = pcVar3[sVar5];
      chr = (unicode_char)bVar1;
      if ((char)bVar1 < -0x60) {
        chr = *(unicode_char *)
               ((anonymous_namespace)::windows1252_replacements + (ulong)(bVar1 - 0x80) * 4);
        bVar4 = bVar4 | (byte)(0x2001a002L >> (bVar1 & 0x3f)) & 1;
      }
      utf8_write(to,chr);
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
    if (bVar4 != 0) {
      local_1b0.level = Warning;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.buffer);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.buffer,
                 "Unexpected data while converting from Windows-1252 to UTF-8.",0x3c);
      logger::~logger(&local_1b0);
    }
  }
  return;
}

Assistant:

void windows1252_to_utf8(const std::string & from, std::string & to) {
	
	to.clear();
	to.reserve(from.size()); // optimistically, most strings only have ASCII characters
	
	bool warn = false;
	
	BOOST_FOREACH(char c, from) {
		
		// Windows-1252 maps almost directly to Unicode - yay!
		unicode_char chr = boost::uint8_t(c);
		if(chr >= 128 && chr < 160) {
			chr = windows1252_replacements[chr - 128];
			warn = warn || chr == replacement_char;
		}
		
		utf8_write(to, chr);
	}
	
	if(warn) {
		log_warning << "Unexpected data while converting from Windows-1252 to UTF-8.";
	}
	
}